

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,cmLocalUnixMakefileGenerator3 *lg)

{
  cmOutputConverter *this_00;
  pointer puVar1;
  cmState *this_01;
  cmGeneratorTarget *this_02;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  pointer puVar5;
  string *psVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  cmValue cVar9;
  char *extraout_RDX;
  pointer puVar10;
  char *pcVar11;
  string_view value;
  string_view source;
  string_view source_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  string localName;
  EchoProgress progress;
  string makefileName;
  string local_258;
  ProgressMapType *local_238;
  pointer local_230;
  string makeTargetName;
  string name;
  string tmp;
  ostringstream progressArg;
  string local_50;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  makeTargetName._M_dataplus._M_p = (pointer)&makeTargetName.field_2;
  makeTargetName._M_string_length = 0;
  makeTargetName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&progressArg,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&progress);
  bVar2 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&progressArg);
  std::__cxx11::string::~string((string *)&progressArg);
  if (!bVar2) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  puVar5 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_230 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
              super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_238 = &this->ProgressMap;
  this_00 = &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  do {
    if (puVar5 == local_230) {
      std::__cxx11::string::~string((string *)&makeTargetName);
      std::__cxx11::string::~string((string *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      return;
    }
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((puVar5->_M_t).
                        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                        .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
    std::__cxx11::string::string((string *)&name,(string *)psVar6);
    if (name._M_string_length != 0) {
      bVar3 = cmGeneratorTarget::IsInBuildSystem
                        ((puVar5->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (bVar3) {
        TVar4 = cmGeneratorTarget::GetType
                          ((puVar5->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar4 != GLOBAL_TARGET) {
          makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
          makefileName._M_string_length = 0;
          makefileName.field_2._M_local_buf[0] = '\0';
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    ((string *)&progressArg,lg,
                     (puVar5->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          _progressArg = (pointer)localName._M_string_length;
          progress.Dir._M_dataplus._M_p = &DAT_0000000b;
          progress.Dir._M_string_length = (size_type)anon_var_dwarf_f37fda;
          cmStrCat<>((string *)&emitted,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&progress);
          std::__cxx11::string::operator=((string *)&makefileName,(string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
          poVar7 = std::operator<<(ruleFileStream,"# Target rules for target ");
          poVar7 = std::operator<<(poVar7,(string *)&localName);
          std::operator<<(poVar7,"\n\n");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          _progressArg = (pointer)localName._M_string_length;
          progress.Dir._M_dataplus._M_p = (pointer)0x7;
          progress.Dir._M_string_length = (size_type)anon_var_dwarf_f38030;
          cmStrCat<>((string *)&emitted,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&progress);
          std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&makeTargetName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          _progressArg = (pointer)localName._M_string_length;
          progress.Dir._M_dataplus._M_p = &DAT_00000006;
          progress.Dir._M_string_length = (size_type)anon_var_dwarf_f37fe6;
          cmStrCat<>((string *)&emitted,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&progress);
          std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&makeTargetName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::__cxx11::string::append((char *)&localName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
          progress.Dir._M_string_length = 0;
          progress.Dir.field_2._M_local_buf[0] = '\0';
          progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
          progress.Arg._M_string_length = 0;
          progress.Arg.field_2._M_local_buf[0] = '\0';
          psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
          _progressArg = (pointer)psVar6->_M_string_length;
          emitted._M_t._M_impl._0_8_ = 0xb;
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_d97eb;
          cmStrCat<>(&tmp,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&emitted);
          std::__cxx11::string::operator=((string *)&progress,(string *)&tmp);
          std::__cxx11::string::~string((string *)&tmp);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
          emitted._M_t._M_impl._0_8_ =
               (puVar5->_M_t).
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
               super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          pmVar8 = std::
                   map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                   ::operator[](local_238,(key_type *)&emitted);
          puVar1 = (pmVar8->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pcVar11 = "";
          for (puVar10 = (pmVar8->Marks).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1)
          {
            poVar7 = std::operator<<((ostream *)&progressArg,pcVar11);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            pcVar11 = ",";
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&progress.Arg,(string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
          this_01 = (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)->
                    State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&progressArg,"TARGET_MESSAGES",(allocator<char> *)&emitted);
          cVar9 = cmState::GetGlobalProperty(this_01,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          if (cVar9.Value == (string *)0x0) {
LAB_0030d744:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &progressArg,"Built target ",&name);
            cmLocalUnixMakefileGenerator3::AppendEcho
                      (lg,&commands,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &progressArg,EchoNormal,&progress);
            std::__cxx11::string::~string((string *)&progressArg);
          }
          else {
            value._M_str = extraout_RDX;
            value._M_len = (size_t)((cVar9.Value)->_M_dataplus)._M_p;
            bVar3 = cmValue::IsOn((cmValue *)(cVar9.Value)->_M_string_length,value);
            if (bVar3) goto LAB_0030d744;
          }
          AppendGlobalTargetDepends
                    (this,&depends,
                     (puVar5->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"All Build rule for target.",&localName,&depends,
                     &commands,true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
          std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
          source._M_str = progress.Dir._M_dataplus._M_p;
          source._M_len = progress.Dir._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    ((string *)&emitted,this_00,source,SHELL);
          std::operator<<((ostream *)&progressArg,(string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
          emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          poVar7 = std::operator<<((ostream *)&progressArg," ");
          CountProgressMarksInTarget
                    (this,(puVar5->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,&emitted);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     &tmp);
          std::__cxx11::string::~string((string *)&tmp);
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~_Rb_tree(&emitted._M_t);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tmp,"CMakeFiles/Makefile2",(allocator<char> *)&progressArg);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&tmp,&localName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
          std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
          source_00._M_str = progress.Dir._M_dataplus._M_p;
          source_00._M_len = progress.Dir._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    ((string *)&emitted,this_00,source_00,SHELL);
          std::operator<<((ostream *)&progressArg,(string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          std::operator<<((ostream *)&progressArg," 0");
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&emitted);
          std::__cxx11::string::~string((string *)&emitted);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          if (!bVar2) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[25]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends
                       ,(char (*) [25])"cmake_check_build_system");
          }
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    (&local_258,lg,
                     (puVar5->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          _progressArg = (pointer)local_258._M_string_length;
          emitted._M_t._M_impl._0_8_ = 5;
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_f380c4;
          cmStrCat<>(&local_50,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&emitted);
          std::__cxx11::string::operator=((string *)&localName,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_258);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"Build rule for subdir invocation for target.",&localName
                     ,&depends,&commands,true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&localName);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"Convenience name for target.",&name,&depends,&commands,
                     true,false);
          this_02 = (puVar5->_M_t).
                    super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                    .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_((string *)&progressArg,lg);
          bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_02,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          if (bVar3) {
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_258,lg,
                       (puVar5->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            _progressArg = (pointer)local_258._M_string_length;
            emitted._M_t._M_impl._0_8_ = 0xb;
            emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_f3800c;
            cmStrCat<>(&local_50,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&emitted);
            std::__cxx11::string::operator=((string *)&localName,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_258);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&depends);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&commands);
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      ((string *)&progressArg,lg,&makefileName,&localName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &progressArg);
            std::__cxx11::string::~string((string *)&progressArg);
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"Pre-install relink rule for target.",&localName,
                       &depends,&commands,true,false);
          }
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    ((string *)&progressArg,lg,
                     (puVar5->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          _progressArg = (pointer)localName._M_string_length;
          emitted._M_t._M_impl._0_8_ = 6;
          emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_f38110;
          cmStrCat<>(&local_50,(cmAlphaNum *)&progressArg,(cmAlphaNum *)&emitted);
          std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&makeTargetName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &progressArg);
          std::__cxx11::string::~string((string *)&progressArg);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"clean rule for target.",&makeTargetName,&depends,
                     &commands,true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::__cxx11::string::~string((string *)&tmp);
          cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
          std::__cxx11::string::~string((string *)&makefileName);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  cmLocalUnixMakefileGenerator3& lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // for each target Generate the rule files for each target.
  for (const auto& gtarget : lg.GetGeneratorTargets()) {
    std::string name = gtarget->GetName();
    if (!name.empty() &&
        (gtarget->IsInBuildSystem() &&
         gtarget->GetType() != cmStateEnums::GLOBAL_TARGET)) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makefileName = cmStrCat(localName, "/build.make");

      lg.WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = cmStrCat(localName, "/depend");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      makeTargetName = cmStrCat(localName, "/build");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = cmStrCat(lg.GetBinaryDirectory(), "/CMakeFiles");
      {
        std::ostringstream progressArg;
        const char* sep = "";
        for (unsigned long progFile : this->ProgressMap[gtarget.get()].Marks) {
          progressArg << sep << progFile;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (cmValue tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = cmIsOn(*tgtMsg);
      }

      if (targetMessages) {
        lg.AppendEcho(commands, "Built target " + name,
                      cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget.get());
      rootLG.WriteMakeRule(ruleFileStream, "All Build rule for target.",
                           localName, depends, commands, true);

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " "
                << this->CountProgressMarksInTarget(gtarget.get(), emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = "CMakeFiles/Makefile2";
      commands.push_back(lg.GetRecursiveMakeCall(tmp, localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      if (regenerate) {
        depends.emplace_back("cmake_check_build_system");
      }
      localName =
        cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()), "/rule");
      rootLG.WriteMakeRule(ruleFileStream,
                           "Build rule for subdir invocation for target.",
                           localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      rootLG.WriteMakeRule(ruleFileStream, "Convenience name for target.",
                           name, depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg.GetConfigName())) {
        localName = cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()),
                             "/preinstall");
        depends.clear();
        commands.clear();
        commands.push_back(lg.GetRecursiveMakeCall(makefileName, localName));
        rootLG.WriteMakeRule(ruleFileStream,
                             "Pre-install relink rule for target.", localName,
                             depends, commands, true);
      }

      // add the clean rule
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makeTargetName = cmStrCat(localName, "/clean");
      depends.clear();
      commands.clear();
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));
      rootLG.WriteMakeRule(ruleFileStream, "clean rule for target.",
                           makeTargetName, depends, commands, true);
      commands.clear();
    }
  }
}